

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                    (int field_number,int32_t value,uint8_t *target)

{
  uint8_t *puVar1;
  
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(field_number << 3,target);
  puVar1 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,puVar1);
  return puVar1;
}

Assistant:

inline uint8_t* WireFormatLite::WriteInt32ToArray(int field_number,
                                                  int32_t value,
                                                  uint8_t* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteInt32NoTagToArray(value, target);
}